

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O2

void feat_s2_4x_cep2feat(feat_t *fcb,mfcc_t **mfc,mfcc_t **feat)

{
  uint32 *puVar1;
  mfcc_t *pmVar2;
  mfcc_t *pmVar3;
  float *pfVar4;
  float *pfVar5;
  mfcc_t *pmVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  ulong uVar18;
  long lVar19;
  ulong uVar17;
  
  if (fcb == (feat_t *)0x0) {
    __assert_fail("fcb",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b1,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->cepsize != 0xd) {
    __assert_fail("feat_cepsize(fcb) == 13",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b2,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->n_stream != 4) {
    __assert_fail("feat_n_stream(fcb) == 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b3,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  puVar1 = fcb->stream_len;
  if (*puVar1 != 0xc) {
    __assert_fail("feat_stream_len(fcb, 0) == 12",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b4,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (puVar1[1] != 0x18) {
    __assert_fail("feat_stream_len(fcb, 1) == 24",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b5,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (puVar1[2] != 3) {
    __assert_fail("feat_stream_len(fcb, 2) == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b6,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (puVar1[3] != 0xc) {
    __assert_fail("feat_stream_len(fcb, 3) == 12",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                  ,0x1b7,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
  }
  if (fcb->window_size == 4) {
    pmVar2 = *feat;
    pmVar3 = *mfc;
    uVar11 = *(undefined8 *)(pmVar3 + 1);
    uVar12 = *(undefined8 *)(pmVar3 + 3);
    uVar13 = *(undefined8 *)(pmVar3 + 5);
    uVar14 = *(undefined8 *)(pmVar3 + 7);
    uVar15 = *(undefined8 *)(pmVar3 + 0xb);
    *(undefined8 *)(pmVar2 + 8) = *(undefined8 *)(pmVar3 + 9);
    *(undefined8 *)(pmVar2 + 10) = uVar15;
    *(undefined8 *)(pmVar2 + 4) = uVar13;
    *(undefined8 *)(pmVar2 + 6) = uVar14;
    *(undefined8 *)pmVar2 = uVar11;
    *(undefined8 *)(pmVar2 + 2) = uVar12;
    pfVar4 = (float *)mfc[-2];
    pfVar5 = (float *)mfc[2];
    pmVar2 = feat[1];
    iVar16 = 1;
    if (1 < fcb->cepsize) {
      iVar16 = fcb->cepsize;
    }
    uVar17 = (ulong)(iVar16 - 1);
    for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
      pmVar2[uVar18] = (mfcc_t)(pfVar5[uVar18 + 1] - pfVar4[uVar18 + 1]);
    }
    pmVar3 = mfc[-4];
    pmVar6 = mfc[4];
    for (uVar18 = 0; uVar17 != uVar18; uVar18 = uVar18 + 1) {
      pmVar2[uVar17 + uVar18] = (mfcc_t)((float)pmVar6[uVar18 + 1] - (float)pmVar3[uVar18 + 1]);
    }
    pfVar7 = (float *)mfc[3];
    pfVar8 = (float *)mfc[-3];
    pfVar9 = (float *)mfc[-1];
    pfVar10 = (float *)mfc[1];
    pmVar2 = feat[3];
    for (lVar19 = 0; uVar17 << 2 != lVar19; lVar19 = lVar19 + 4) {
      *(float *)((long)pmVar2 + lVar19) =
           (*(float *)((long)pfVar7 + lVar19 + 4) - *(float *)((long)pfVar9 + lVar19 + 4)) -
           (*(float *)((long)pfVar10 + lVar19 + 4) - *(float *)((long)pfVar8 + lVar19 + 4));
    }
    pmVar2 = feat[2];
    *pmVar2 = **mfc;
    pmVar2[1] = (mfcc_t)(*pfVar5 - *pfVar4);
    pmVar2[2] = (mfcc_t)((*pfVar7 - *pfVar9) - (*pfVar10 - *pfVar8));
    return;
  }
  __assert_fail("feat_window_size(fcb) == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/feat.c"
                ,0x1b8,"void feat_s2_4x_cep2feat(feat_t *, mfcc_t **, mfcc_t **)");
}

Assistant:

static void
feat_s2_4x_cep2feat(feat_t * fcb, mfcc_t ** mfc, mfcc_t ** feat)
{
    mfcc_t *f;
    mfcc_t *w, *_w;
    mfcc_t *w1, *w_1, *_w1, *_w_1;
    mfcc_t d1, d2;
    int32 i, j;

    assert(fcb);
    assert(feat_cepsize(fcb) == 13);
    assert(feat_n_stream(fcb) == 4);
    assert(feat_stream_len(fcb, 0) == 12);
    assert(feat_stream_len(fcb, 1) == 24);
    assert(feat_stream_len(fcb, 2) == 3);
    assert(feat_stream_len(fcb, 3) == 12);
    assert(feat_window_size(fcb) == 4);

    /* CEP; skip C0 */
    memcpy(feat[0], mfc[0] + 1, (feat_cepsize(fcb) - 1) * sizeof(mfcc_t));

    /*
     * DCEP(SHORT): mfc[2] - mfc[-2]
     * DCEP(LONG):  mfc[4] - mfc[-4]
     */
    w = mfc[2] + 1;             /* +1 to skip C0 */
    _w = mfc[-2] + 1;

    f = feat[1];
    for (i = 0; i < feat_cepsize(fcb) - 1; i++) /* Short-term */
        f[i] = w[i] - _w[i];

    w = mfc[4] + 1;             /* +1 to skip C0 */
    _w = mfc[-4] + 1;

    for (j = 0; j < feat_cepsize(fcb) - 1; i++, j++)    /* Long-term */
        f[i] = w[j] - _w[j];

    /* D2CEP: (mfc[3] - mfc[-1]) - (mfc[1] - mfc[-3]) */
    w1 = mfc[3] + 1;            /* Final +1 to skip C0 */
    _w1 = mfc[-1] + 1;
    w_1 = mfc[1] + 1;
    _w_1 = mfc[-3] + 1;

    f = feat[3];
    for (i = 0; i < feat_cepsize(fcb) - 1; i++) {
        d1 = w1[i] - _w1[i];
        d2 = w_1[i] - _w_1[i];

        f[i] = d1 - d2;
    }

    /* POW: C0, DC0, D2C0; differences computed as above for rest of cep */
    f = feat[2];
    f[0] = mfc[0][0];
    f[1] = mfc[2][0] - mfc[-2][0];

    d1 = mfc[3][0] - mfc[-1][0];
    d2 = mfc[1][0] - mfc[-3][0];
    f[2] = d1 - d2;
}